

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

StandAloneFreeListPolicy * Memory::StandAloneFreeListPolicy::NewInternal(uint entries)

{
  HeapAllocator *this;
  StandAloneFreeListPolicy *__s;
  size_t byteSize;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)entries * 0x10 + 0x100);
  local_48 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26b6f76;
  data.filename._0_4_ = 0x3c5;
  this = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,(TrackAllocData *)local_48);
  byteSize = (ulong)entries * 0x10 + 0x120;
  __s = (StandAloneFreeListPolicy *)HeapAllocator::AllocT<true>(this,byteSize);
  if (__s == (StandAloneFreeListPolicy *)0x0) {
    _DAT_00000010 = 0;
    uRam0000000000000018 = 0;
    _DAT_00000000 = 0;
    _DAT_00000008 = 0;
  }
  else {
    memset(__s,0,byteSize);
    __s->allocated = 0;
    __s->used = 0;
    *(undefined8 *)&__s->freeList = 0;
    __s->freeObjectLists = (uint *)0x0;
    __s->entries = (FreeObjectListEntry *)0x0;
    __s->allocated = entries;
    __s->freeObjectLists = &__s[1].allocated;
    __s->entries = (FreeObjectListEntry *)(__s + 9);
  }
  return __s;
}

Assistant:

StandAloneFreeListPolicy * StandAloneFreeListPolicy::NewInternal(uint entries)
{
    size_t plusSize = buckets * sizeof(uint) + entries * sizeof(FreeObjectListEntry);
    StandAloneFreeListPolicy * _this = HeapNewNoThrowPlusZ(plusSize, StandAloneFreeListPolicy);

    if (NULL != _this)
    {
        _this->allocated = entries;
        _this->freeObjectLists = (uint *)(_this + 1);
        _this->entries = (FreeObjectListEntry *)(_this->freeObjectLists + buckets);
    }

    return _this;
}